

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void Search::clear_cache_hash_map(search_private *priv)

{
  v_hashmap<unsigned_char_*,_Search::scored_action>::iter(&priv->cache_hash_map,free_key);
  v_hashmap<unsigned_char_*,_Search::scored_action>::clear(&priv->cache_hash_map);
  return;
}

Assistant:

void clear_cache_hash_map(search_private& priv)
{
  priv.cache_hash_map.iter(free_key);
  priv.cache_hash_map.clear();
}